

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

uint __thiscall cmCTestGIT::GetGitVersion(cmCTestGIT *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long *plVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  uint v [4];
  string version;
  OneLineParser version_out;
  string git;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_version;
  OutputLogger version_err;
  undefined8 local_138;
  undefined8 uStack_130;
  string local_128;
  string local_108;
  undefined1 local_e8 [32];
  long *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [2];
  long *local_a0;
  long local_98;
  long local_90 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  OutputLogger local_68;
  
  uVar5 = this->CurrentGitVersion;
  if (uVar5 == 0) {
    pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
    local_a0 = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar2,
               pcVar2 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool.
                        _M_string_length);
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_e8,local_a0,local_98 + (long)local_a0)
    ;
    plVar7 = (long *)(local_c0[0]._M_local_buf + 8);
    local_c8 = plVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"--version","");
    __l._M_len = 2;
    __l._M_array = (iterator)local_e8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_80,__l,(allocator_type *)&local_68);
    lVar6 = -0x40;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      plVar7 = plVar7 + -4;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0);
    local_108._M_string_length = 0;
    local_108.field_2._M_local_buf[0] = '\0';
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    OneLineParser::OneLineParser((OneLineParser *)local_e8,this,"version-out> ",&local_108);
    cmProcessTools::OutputLogger::OutputLogger
              (&local_68,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"version-err> ");
    local_138 = 0;
    uStack_130 = 0;
    paVar1 = &local_128.field_2;
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    local_128._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = cmCTestVC::RunChild((cmCTestVC *)this,&local_80,(OutputParser *)local_e8,
                                (OutputParser *)&local_68,&local_128,Auto);
    if (bVar3) {
      iVar4 = __isoc99_sscanf(local_108._M_dataplus._M_p,"git version %u.%u.%u.%u",&local_138,
                              (long)&local_138 + 4,&uStack_130,(long)&uStack_130 + 4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,
                        CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                 local_128.field_2._M_local_buf[0]) + 1);
      }
      if (2 < iVar4) {
        this->CurrentGitVersion =
             (int)uStack_130 * 1000 + local_138._4_4_ * 100000 + (int)local_138 * 10000000 +
             uStack_130._4_4_;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,
                      CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                               local_128.field_2._M_local_buf[0]) + 1);
    }
    local_68.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_00bbdac8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.super_LineParser.Line._M_dataplus._M_p !=
        &local_68.super_LineParser.Line.field_2) {
      operator_delete(local_68.super_LineParser.Line._M_dataplus._M_p,
                      local_68.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    local_e8._0_8_ = &PTR__LineParser_00bbdac8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._24_8_ != local_c0) {
      operator_delete((void *)local_e8._24_8_,local_c0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_80);
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    uVar5 = this->CurrentGitVersion;
  }
  return uVar5;
}

Assistant:

unsigned int cmCTestGIT::GetGitVersion()
{
  if (!this->CurrentGitVersion) {
    std::string git = this->CommandLineTool;
    std::vector<std::string> git_version = { git, "--version" };
    std::string version;
    OneLineParser version_out(this, "version-out> ", version);
    OutputLogger version_err(this->Log, "version-err> ");
    unsigned int v[4] = { 0, 0, 0, 0 };
    if (this->RunChild(git_version, &version_out, &version_err) &&
        sscanf(version.c_str(), "git version %u.%u.%u.%u", &v[0], &v[1], &v[2],
               &v[3]) >= 3) {
      this->CurrentGitVersion = cmCTestGITVersion(v[0], v[1], v[2], v[3]);
    }
  }
  return this->CurrentGitVersion;
}